

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicBlock.cc
# Opt level: O3

int __thiscall
flow::BasicBlock::verify
          (BasicBlock *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  Instr *pIVar1;
  _func_int **pp_Var2;
  bool bVar3;
  int iVar4;
  int extraout_EAX;
  BasicBlock *in_RAX;
  ulong uVar5;
  size_t extraout_RDX;
  size_t sVar6;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  long lVar7;
  _func_int **pp_Var8;
  pointer puVar9;
  pointer_____offset_0x10___ *sig_00;
  pointer puVar10;
  pointer puVar11;
  undefined1 auVar12 [16];
  BasicBlock *local_38;
  
  puVar9 = (this->code_).
           super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar10 = (this->code_).
            super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar10 == puVar9) {
    verify((EVP_PKEY_CTX *)this,(uchar *)ctx,(size_t)sig,(uchar *)siglen,(size_t)tbs);
    sVar6 = extraout_RDX_00;
    sig_00 = (pointer_____offset_0x10___ *)ctx;
  }
  else {
    bVar3 = isComplete(this);
    sVar6 = extraout_RDX;
    sig_00 = (pointer_____offset_0x10___ *)ctx;
    if (bVar3) {
      puVar10 = puVar10 + -1;
      uVar5 = (long)puVar10 - (long)puVar9;
      if (0 < (long)uVar5 >> 5) {
        puVar11 = (pointer)((long)&(puVar9->_M_t).
                                   super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>
                                   .super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl +
                           (uVar5 & 0xffffffffffffffe0));
        lVar7 = ((long)uVar5 >> 5) + 1;
        puVar9 = puVar9 + 2;
        do {
          pIVar1 = puVar9[-2]._M_t.
                   super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>._M_t.
                   super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
                   super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl;
          if (pIVar1 != (Instr *)0x0) {
            sig_00 = &Instr::typeinfo;
            siglen = 0;
            auVar12 = __dynamic_cast(pIVar1,&Instr::typeinfo,&TerminateInstr::typeinfo);
            if (auVar12._0_8_ != 0) {
              puVar9 = puVar9 + -2;
              goto LAB_0013e064;
            }
          }
          pIVar1 = puVar9[-1]._M_t.
                   super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>._M_t.
                   super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
                   super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl;
          if (pIVar1 != (Instr *)0x0) {
            sig_00 = &Instr::typeinfo;
            siglen = 0;
            auVar12 = __dynamic_cast(pIVar1,&Instr::typeinfo,&TerminateInstr::typeinfo);
            if (auVar12._0_8_ != 0) {
              puVar9 = puVar9 + -1;
              goto LAB_0013e064;
            }
          }
          pIVar1 = (puVar9->_M_t).
                   super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>._M_t.
                   super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
                   super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl;
          if (pIVar1 != (Instr *)0x0) {
            sig_00 = &Instr::typeinfo;
            siglen = 0;
            auVar12 = __dynamic_cast(pIVar1,&Instr::typeinfo,&TerminateInstr::typeinfo);
            if (auVar12._0_8_ != 0) goto LAB_0013e064;
          }
          pIVar1 = puVar9[1]._M_t.
                   super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>._M_t.
                   super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
                   super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl;
          if (pIVar1 != (Instr *)0x0) {
            sig_00 = &Instr::typeinfo;
            siglen = 0;
            auVar12 = __dynamic_cast(pIVar1,&Instr::typeinfo,&TerminateInstr::typeinfo);
            if (auVar12._0_8_ != 0) {
              puVar9 = puVar9 + 1;
              goto LAB_0013e064;
            }
          }
          lVar7 = lVar7 + -1;
          puVar9 = puVar9 + 4;
        } while (1 < lVar7);
        uVar5 = (long)puVar10 - (long)puVar11;
        puVar9 = puVar11;
      }
      lVar7 = (long)uVar5 >> 3;
      if (lVar7 == 1) {
LAB_0013e02c:
        pIVar1 = (puVar9->_M_t).
                 super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>._M_t.
                 super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
                 super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl;
        if (pIVar1 == (Instr *)0x0) goto LAB_0013e069;
        sig_00 = &Instr::typeinfo;
        siglen = 0;
        auVar12 = __dynamic_cast(pIVar1,&Instr::typeinfo,&TerminateInstr::typeinfo);
        lVar7 = auVar12._0_8_;
        if (lVar7 == 0) goto LAB_0013e069;
      }
      else {
        if (lVar7 == 2) {
LAB_0013e005:
          pIVar1 = (puVar9->_M_t).
                   super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>._M_t.
                   super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
                   super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl;
          if (pIVar1 != (Instr *)0x0) {
            sig_00 = &Instr::typeinfo;
            siglen = 0;
            auVar12 = __dynamic_cast(pIVar1,&Instr::typeinfo,&TerminateInstr::typeinfo);
            lVar7 = auVar12._0_8_;
            if (lVar7 != 0) goto LAB_0013e064;
          }
          puVar9 = puVar9 + 1;
          goto LAB_0013e02c;
        }
        if (lVar7 != 3) goto LAB_0013e069;
        pIVar1 = (puVar9->_M_t).
                 super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>._M_t.
                 super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
                 super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl;
        if (pIVar1 == (Instr *)0x0) {
LAB_0013e001:
          puVar9 = puVar9 + 1;
          goto LAB_0013e005;
        }
        sig_00 = &Instr::typeinfo;
        siglen = 0;
        auVar12 = __dynamic_cast(pIVar1,&Instr::typeinfo,&TerminateInstr::typeinfo);
        lVar7 = auVar12._0_8_;
        if (lVar7 == 0) goto LAB_0013e001;
      }
LAB_0013e064:
      sVar6 = auVar12._8_8_;
      lVar7 = auVar12._0_8_;
      local_38 = this;
      if (puVar9 == puVar10) {
LAB_0013e069:
        return (int)lVar7;
      }
      goto LAB_0013e088;
    }
  }
  verify((EVP_PKEY_CTX *)this,(uchar *)sig_00,sVar6,(uchar *)siglen,(size_t)tbs);
  sVar6 = extraout_RDX_01;
  local_38 = in_RAX;
LAB_0013e088:
  iVar4 = verify((EVP_PKEY_CTX *)local_38,(uchar *)sig_00,sVar6,(uchar *)siglen,(size_t)tbs);
  pp_Var8 = (local_38->super_Value)._vptr_Value;
  pp_Var2 = *(_func_int ***)&(local_38->super_Value).type_;
  if (pp_Var8 != pp_Var2) {
    do {
      if (*pp_Var8 != (_func_int *)0x0) {
        iVar4 = (**(code **)(*(long *)*pp_Var8 + 8))();
      }
      *pp_Var8 = (_func_int *)0x0;
      pp_Var8 = pp_Var8 + 1;
    } while (pp_Var8 != pp_Var2);
    pp_Var8 = (local_38->super_Value)._vptr_Value;
  }
  if (pp_Var8 == (_func_int **)0x0) {
    return iVar4;
  }
  operator_delete(pp_Var8,(long)(local_38->super_Value).name_._M_dataplus._M_p - (long)pp_Var8);
  return extraout_EAX;
}

Assistant:

void BasicBlock::verify() {
  FLOW_ASSERT(code_.size() > 0, fmt::format("BasicBlock {}: verify: Must contain at least one instruction.", name()));
  FLOW_ASSERT(isComplete(), fmt::format("BasicBlock {}: verify: Last instruction must be a terminator instruction.", name()));
  FLOW_ASSERT(
      std::find_if(code_.begin(), std::prev(code_.end()), [&](std::unique_ptr<Instr>& instr) -> bool {
        return dynamic_cast<TerminateInstr*>(instr.get()) != nullptr;
      }) == std::prev(code_.end()),
      fmt::format("BasicBlock {}: verify: Found a terminate instruction in the middle of the block.", name()));
}